

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::utils::FloatProxy<float>::GetWords
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FloatProxy<float> *this)

{
  uint_type local_c;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c = this->data_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (__return_storage_ptr__,&local_c);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> GetWords() const {
    std::vector<uint32_t> words;
    if (FloatProxyTraits<T>::width() == 64) {
      FloatProxyTraits<double>::uint_type d = data();
      words.push_back(static_cast<uint32_t>(d));
      words.push_back(static_cast<uint32_t>(d >> 32));
    } else {
      words.push_back(static_cast<uint32_t>(data()));
    }
    return words;
  }